

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsLineItem::QGraphicsLineItem(QGraphicsLineItem *this,QGraphicsItem *parent)

{
  QGraphicsLineItemPrivate *this_00;
  
  this_00 = (QGraphicsLineItemPrivate *)operator_new(0x1a0);
  QGraphicsLineItemPrivate::QGraphicsLineItemPrivate(this_00);
  QGraphicsItem::QGraphicsItem(&this->super_QGraphicsItem,(QGraphicsItemPrivate *)this_00,parent);
  (this->super_QGraphicsItem)._vptr_QGraphicsItem = (_func_int **)&PTR__QGraphicsPixmapItem_007ebd38
  ;
  return;
}

Assistant:

QGraphicsLineItem::QGraphicsLineItem(QGraphicsItem *parent)
    : QGraphicsItem(*new QGraphicsLineItemPrivate, parent)
{
}